

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h2h3.c
# Opt level: O2

CURLcode Curl_pseudo_headers(Curl_easy *data,char *mem,size_t len,h2h3req **hp)

{
  char **ppcVar1;
  char cVar2;
  connectdata *pcVar3;
  size_t sVar4;
  h2h3req *phVar5;
  size_t sVar6;
  size_t sVar7;
  int iVar8;
  ulong uVar9;
  h2h3req *phVar10;
  char *pcVar11;
  void *pvVar12;
  size_t sVar13;
  char *pcVar14;
  h2h3pseudo *phVar15;
  char *pcVar16;
  char *pcVar17;
  char *second;
  ulong uVar18;
  size_t sVar19;
  size_t *psVar20;
  ulong uVar21;
  char *pcStack_a0;
  ulong local_80;
  ulong local_70;
  h2h3pseudo authority;
  
  pcVar3 = data->conn;
  uVar21 = 0;
  for (uVar9 = 1; uVar9 < len; uVar9 = uVar9 + 1) {
    if ((mem[uVar9] == '\n') && (mem[uVar9 - 1] == '\r')) {
      uVar21 = uVar21 + 1;
      uVar9 = uVar9 + 1;
    }
  }
  if ((uVar21 < 2) ||
     (phVar10 = (h2h3req *)(*Curl_cmalloc)(uVar21 * 0x20 + 0x28), phVar10 == (h2h3req *)0x0)) {
    phVar10 = (h2h3req *)0x0;
  }
  else {
    pcVar11 = (char *)memchr(mem,0xd,len);
    if (pcVar11 != (char *)0x0) {
      pvVar12 = memchr(mem,0x20,(long)pcVar11 - (long)mem);
      if ((long)pvVar12 - (long)mem != 0 && pvVar12 != (void *)0x0) {
        uVar21 = uVar21 + 1;
        phVar10->header[0].name = ":method";
        phVar10->header[0].namelen = 7;
        phVar10->header[0].value = mem;
        phVar10->header[0].valuelen = (long)pvVar12 - (long)mem;
        pcVar16 = pcVar11 + (-2 - (long)pvVar12);
        while( true ) {
          if (pcVar16 == (char *)0xffffffffffffffff) goto LAB_004b60fb;
          if (pcVar16[(long)pvVar12 + 1] == ' ') break;
          pcVar16 = pcVar16 + -1;
        }
        if (pcVar16 == (char *)0x0) goto LAB_004b60fb;
        phVar10[1].entries = (size_t)":path";
        phVar10[1].header[0].name = (char *)0x5;
        phVar10[1].header[0].namelen = (long)pvVar12 + 1;
        phVar10[1].header[0].value = pcVar16;
        phVar10[1].header[0].valuelen = (size_t)":scheme";
        phVar10[2].entries = 7;
        pcVar16 = Curl_checkheaders(data,":scheme",7);
        if (pcVar16 == (char *)0x0) {
          if ((pcVar3->handler->flags & 1) == 0) {
            pcVar16 = "http";
          }
          else {
            pcVar16 = "https";
          }
          phVar10[2].header[0].name = pcVar16;
        }
        else {
          for (pcVar16 = pcVar16 + 8; (*pcVar16 == ' ' || (*pcVar16 == '\t')); pcVar16 = pcVar16 + 1
              ) {
          }
          phVar10[2].header[0].name = pcVar16;
          Curl_infof(data,"set pseudo header %s to %s",":scheme",pcVar16);
          pcVar16 = phVar10[2].header[0].name;
        }
        sVar13 = strlen(pcVar16);
        phVar10[2].header[0].namelen = sVar13;
        local_80 = 3;
        local_70 = 0;
        do {
          while( true ) {
            if (uVar21 <= local_80) {
              if ((local_70 != 0) && (local_70 != 3)) {
                pcVar11 = phVar10->header[local_70].name;
                sVar19 = phVar10->header[local_70].namelen;
                ppcVar1 = &phVar10->header[local_70].value;
                pcVar16 = *ppcVar1;
                sVar4 = (size_t)ppcVar1[1];
                phVar15 = phVar10->header + local_70;
                for (; 3 < local_70; local_70 = local_70 - 1) {
                  sVar6 = *(size_t *)((long)(phVar15 + -1) + 8);
                  sVar7 = *(size_t *)((long)(phVar15 + -1) + 0x18);
                  phVar15->value = *(char **)((long)(phVar15 + -1) + 0x10);
                  phVar15->valuelen = sVar7;
                  phVar15->name = phVar15[-1].name;
                  phVar15->namelen = sVar6;
                  phVar15 = phVar15 + -1;
                }
                phVar15->value = pcVar16;
                phVar15->valuelen = sVar4;
                phVar15->name = pcVar11;
                phVar15->namelen = sVar19;
              }
              uVar9 = 0;
              phVar5 = phVar10;
              for (uVar18 = 0; psVar20 = &phVar5->header[0].valuelen, uVar21 != uVar18;
                  uVar18 = uVar18 + 1) {
                sVar19 = phVar5->header[0].namelen;
                sVar4 = *psVar20;
                uVar9 = uVar9 + sVar19 + sVar4;
                Curl_infof(data,"h2h3 [%.*s: %.*s]",sVar19,phVar5->header[0].name,sVar4,
                           phVar5->header[0].value);
                phVar5 = (h2h3req *)psVar20;
              }
              if (60000 < uVar9) {
                Curl_infof(data,
                           "http_request: Warning: The cumulative length of all headers exceeds %d bytes and that could cause the stream to be rejected."
                           ,60000);
              }
              phVar10->entries = uVar21;
              *hp = phVar10;
              return CURLE_OK;
            }
            pcVar16 = pcVar11 + 2;
            pcVar14 = (char *)memchr(pcVar16,0xd,(size_t)(mem + (len - (long)pcVar16)));
            if ((((pcVar14 == (char *)0x0) || (pcVar14 == pcVar16)) || (*pcVar16 == '\t')) ||
               (*pcVar16 == ' ')) goto LAB_004b60fb;
            second = pcVar11 + 3;
            pcVar17 = pcVar14 + (-3 - (long)pcVar11);
            for (sVar19 = 0; (pcVar11 = pcVar16 + sVar19, pcVar11 < pcVar14 && (*pcVar11 != ':'));
                sVar19 = sVar19 + 1) {
              second = second + 1;
              pcVar17 = pcVar17 + -1;
            }
            if ((sVar19 == 0) || (pcVar11 == pcVar14)) goto LAB_004b60fb;
            if ((sVar19 == 4) && (iVar8 = Curl_strncasecompare("host",pcVar16,4), iVar8 != 0)) {
              pcVar16 = ":authority";
              phVar10->header[local_80].name = ":authority";
              phVar10->header[local_80].namelen = 10;
              local_70 = local_80;
            }
            else {
              phVar10->header[local_80].namelen = sVar19;
              Curl_strntolower(pcVar16,pcVar16,sVar19);
              phVar10->header[local_80].name = pcVar16;
            }
            for (; (*second == ' ' || (*second == '\t')); second = second + 1) {
              pcVar17 = pcVar17 + -1;
            }
            sVar19 = phVar10->header[local_80].namelen;
            pcVar11 = pcVar14;
            if (sVar19 != 2) break;
            iVar8 = Curl_strncasecompare("te",pcVar16,2);
            if (iVar8 != 0) {
              while (second != pcVar14) {
                if ((*second == ' ') || (*second == '\t')) {
                  second = second + 1;
                }
                else {
                  if ((ulong)((long)pcVar14 - (long)second) < 8) break;
                  iVar8 = Curl_strncasecompare("trailers",second,8);
                  if (iVar8 != 0) {
                    second = second + 8;
                    while( true ) {
                      if (second == pcVar14) goto LAB_004b64e1;
                      cVar2 = *second;
                      if ((cVar2 != '\t') && (cVar2 != ' ')) break;
                      second = second + 1;
                    }
                    if (cVar2 == ',') {
LAB_004b64e1:
                      second = "trailers";
                      pcStack_a0 = (char *)0x8;
                      pcVar17 = pcStack_a0;
                      goto LAB_004b64c2;
                    }
                  }
                  do {
                    if (second == pcVar14) goto LAB_004b64ed;
                    pcVar16 = second + 1;
                    cVar2 = *second;
                    second = pcVar16;
                  } while (cVar2 != ',');
                }
              }
              goto LAB_004b64ed;
            }
LAB_004b64c2:
            phVar10->header[local_80].value = second;
            phVar10->header[local_80].valuelen = (size_t)pcVar17;
            local_80 = local_80 + 1;
          }
          if (sVar19 == 7) {
            pcVar14 = "upgrade";
            pcStack_a0 = (char *)0x7;
          }
          else if (sVar19 == 10) {
            iVar8 = Curl_strncasecompare("connection",pcVar16,10);
            if (iVar8 != 0) goto LAB_004b64ed;
            pcVar14 = "keep-alive";
            pcStack_a0 = (char *)0xa;
          }
          else if (sVar19 == 0x10) {
            pcVar14 = "proxy-connection";
            pcStack_a0 = (char *)0x10;
          }
          else {
            if (sVar19 != 0x11) goto LAB_004b64c2;
            pcVar14 = "transfer-encoding";
            pcStack_a0 = (char *)0x11;
          }
          iVar8 = Curl_strncasecompare(pcVar14,pcVar16,(size_t)pcStack_a0);
          if (iVar8 == 0) goto LAB_004b64c2;
LAB_004b64ed:
          uVar21 = uVar21 - 1;
        } while( true );
      }
    }
  }
LAB_004b60fb:
  (*Curl_cfree)(phVar10);
  return CURLE_OUT_OF_MEMORY;
}

Assistant:

CURLcode Curl_pseudo_headers(struct Curl_easy *data,
                             const char *mem, /* the request */
                             const size_t len /* size of request */,
                             struct h2h3req **hp)
{
  struct connectdata *conn = data->conn;
  size_t nheader = 0;
  size_t i;
  size_t authority_idx;
  char *hdbuf = (char *)mem;
  char *end, *line_end;
  struct h2h3pseudo *nva = NULL;
  struct h2h3req *hreq = NULL;
  char *vptr;

  /* Calculate number of headers contained in [mem, mem + len). Assumes a
     correctly generated HTTP header field block. */
  for(i = 1; i < len; ++i) {
    if(hdbuf[i] == '\n' && hdbuf[i - 1] == '\r') {
      ++nheader;
      ++i;
    }
  }
  if(nheader < 2) {
    goto fail;
  }
  /* We counted additional 2 \r\n in the first and last line. We need 3
     new headers: :method, :path and :scheme. Therefore we need one
     more space. */
  nheader += 1;
  hreq = malloc(sizeof(struct h2h3req) +
                sizeof(struct h2h3pseudo) * (nheader - 1));
  if(!hreq) {
    goto fail;
  }

  nva = &hreq->header[0];

  /* Extract :method, :path from request line
     We do line endings with CRLF so checking for CR is enough */
  line_end = memchr(hdbuf, '\r', len);
  if(!line_end) {
    goto fail;
  }

  /* Method does not contain spaces */
  end = memchr(hdbuf, ' ', line_end - hdbuf);
  if(!end || end == hdbuf)
    goto fail;
  nva[0].name = H2H3_PSEUDO_METHOD;
  nva[0].namelen = sizeof(H2H3_PSEUDO_METHOD) - 1;
  nva[0].value = hdbuf;
  nva[0].valuelen = (size_t)(end - hdbuf);

  hdbuf = end + 1;

  /* Path may contain spaces so scan backwards */
  end = NULL;
  for(i = (size_t)(line_end - hdbuf); i; --i) {
    if(hdbuf[i - 1] == ' ') {
      end = &hdbuf[i - 1];
      break;
    }
  }
  if(!end || end == hdbuf)
    goto fail;
  nva[1].name = H2H3_PSEUDO_PATH;
  nva[1].namelen = sizeof(H2H3_PSEUDO_PATH) - 1;
  nva[1].value = hdbuf;
  nva[1].valuelen = (end - hdbuf);

  nva[2].name = H2H3_PSEUDO_SCHEME;
  nva[2].namelen = sizeof(H2H3_PSEUDO_SCHEME) - 1;
  vptr = Curl_checkheaders(data, STRCONST(H2H3_PSEUDO_SCHEME));
  if(vptr) {
    vptr += sizeof(H2H3_PSEUDO_SCHEME);
    while(*vptr && ISBLANK(*vptr))
      vptr++;
    nva[2].value = vptr;
    infof(data, "set pseudo header %s to %s", H2H3_PSEUDO_SCHEME, vptr);
  }
  else {
    if(conn->handler->flags & PROTOPT_SSL)
      nva[2].value = "https";
    else
      nva[2].value = "http";
  }
  nva[2].valuelen = strlen((char *)nva[2].value);

  authority_idx = 0;
  i = 3;
  while(i < nheader) {
    size_t hlen;

    hdbuf = line_end + 2;

    /* check for next CR, but only within the piece of data left in the given
       buffer */
    line_end = memchr(hdbuf, '\r', len - (hdbuf - (char *)mem));
    if(!line_end || (line_end == hdbuf))
      goto fail;

    /* header continuation lines are not supported */
    if(*hdbuf == ' ' || *hdbuf == '\t')
      goto fail;

    for(end = hdbuf; end < line_end && *end != ':'; ++end)
      ;
    if(end == hdbuf || end == line_end)
      goto fail;
    hlen = end - hdbuf;

    if(hlen == 4 && strncasecompare("host", hdbuf, 4)) {
      authority_idx = i;
      nva[i].name = H2H3_PSEUDO_AUTHORITY;
      nva[i].namelen = sizeof(H2H3_PSEUDO_AUTHORITY) - 1;
    }
    else {
      nva[i].namelen = (size_t)(end - hdbuf);
      /* Lower case the header name for HTTP/3 */
      Curl_strntolower((char *)hdbuf, hdbuf, nva[i].namelen);
      nva[i].name = hdbuf;
    }
    hdbuf = end + 1;
    while(*hdbuf == ' ' || *hdbuf == '\t')
      ++hdbuf;
    end = line_end;

    switch(inspect_header((const char *)nva[i].name, nva[i].namelen, hdbuf,
                          end - hdbuf)) {
    case HEADERINST_IGNORE:
      /* skip header fields prohibited by HTTP/2 specification. */
      --nheader;
      continue;
    case HEADERINST_TE_TRAILERS:
      nva[i].value = "trailers";
      nva[i].valuelen = sizeof("trailers") - 1;
      break;
    default:
      nva[i].value = hdbuf;
      nva[i].valuelen = (end - hdbuf);
    }

    ++i;
  }

  /* :authority must come before non-pseudo header fields */
  if(authority_idx && authority_idx != AUTHORITY_DST_IDX) {
    struct h2h3pseudo authority = nva[authority_idx];
    for(i = authority_idx; i > AUTHORITY_DST_IDX; --i) {
      nva[i] = nva[i - 1];
    }
    nva[i] = authority;
  }

  /* Warn stream may be rejected if cumulative length of headers is too
     large. */
#define MAX_ACC 60000  /* <64KB to account for some overhead */
  {
    size_t acc = 0;

    for(i = 0; i < nheader; ++i) {
      acc += nva[i].namelen + nva[i].valuelen;

      infof(data, "h2h3 [%.*s: %.*s]",
            (int)nva[i].namelen, nva[i].name,
            (int)nva[i].valuelen, nva[i].value);
    }

    if(acc > MAX_ACC) {
      infof(data, "http_request: Warning: The cumulative length of all "
            "headers exceeds %d bytes and that could cause the "
            "stream to be rejected.", MAX_ACC);
    }
  }

  hreq->entries = nheader;
  *hp = hreq;

  return CURLE_OK;

  fail:
  free(hreq);
  return CURLE_OUT_OF_MEMORY;
}